

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O0

InitializeResult * __thiscall
lscpp::my_lsp_server::initialize
          (InitializeResult *__return_storage_ptr__,my_lsp_server *this,InitializeParams *params)

{
  undefined1 local_cc [8];
  TextDocumentSyncOptions sync;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_a0 [8];
  ServerCapabilities capabilites;
  InitializeParams *params_local;
  my_lsp_server *this_local;
  InitializeResult *result;
  
  capabilites.diagnosticProvider.
  super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
  super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
  super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._56_8_ = params;
  protocol::ServerCapabilities::ServerCapabilities((ServerCapabilities *)local_a0);
  capabilites.textDocumentSync.
  super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
  super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload._M_value.
  willSave = true;
  sync.change._0_1_ = None;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8);
  std::optional<lscpp::protocol::CompletionOptions>::operator=
            ((optional<lscpp::protocol::CompletionOptions> *)&capabilites.hoverProvider,
             (CompletionOptions *)&sync.change);
  protocol::CompletionOptions::~CompletionOptions((CompletionOptions *)&sync.change);
  capabilites.textDocumentSync.
  super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
  super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload._M_value.
  willSaveWaitUntil = true;
  protocol::TextDocumentSyncOptions::TextDocumentSyncOptions((TextDocumentSyncOptions *)local_cc);
  local_cc[0] = true;
  local_cc._4_4_ = Full;
  std::optional<lscpp::protocol::TextDocumentSyncOptions>::operator=
            ((optional<lscpp::protocol::TextDocumentSyncOptions> *)local_a0,
             (TextDocumentSyncOptions *)local_cc);
  protocol::ServerCapabilities::ServerCapabilities
            (&__return_storage_ptr__->capabilities,(ServerCapabilities *)local_a0);
  protocol::ServerCapabilities::~ServerCapabilities((ServerCapabilities *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

protocol::InitializeResult
  initialize(const protocol::InitializeParams &params) override {
    protocol::ServerCapabilities capabilites;
    capabilites.hoverProvider = true;
    capabilites.completionProvider = protocol::CompletionOptions{};
    capabilites.definitionProvider = true;
    protocol::TextDocumentSyncOptions sync;
    sync.openClose = true;
    sync.change = protocol::TextDocumentSyncKind::Full;
    capabilites.textDocumentSync = sync;
    protocol::InitializeResult result{capabilites};
    return result;
  }